

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O2

bool __thiscall
pstore::romfs::directory::check
          (directory *this,not_null<const_pstore::romfs::directory_*> parent,
          check_stack_entry *visited)

{
  pointer pvVar1;
  size_t sVar2;
  directory *this_00;
  bool bVar3;
  bool bVar4;
  int iVar5;
  iterator d;
  iterator d_00;
  not_null<const_pstore::romfs::directory_*> *pnVar6;
  pointer pvVar7;
  check_stack_entry *pcVar8;
  long lVar9;
  pointer pvVar10;
  dirent *__name;
  check_stack_entry me;
  error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> od;
  not_null<const_pstore::romfs::directory_*> local_70;
  check_stack_entry *local_68;
  check_stack_entry local_60;
  error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> local_50;
  not_null<const_directory_*> local_38;
  
  sVar2 = this->size_;
  pvVar7 = (this->members_).ptr_;
  lVar9 = sVar2 * 0x28;
  pvVar1 = pvVar7 + sVar2;
  for (pcVar8 = visited; pcVar8 != (check_stack_entry *)0x0; pcVar8 = pcVar8->prev) {
    if ((pcVar8->d).ptr_ == parent.ptr_) {
      return true;
    }
  }
  pvVar10 = pvVar7;
  if (sVar2 != 0) {
    do {
      lVar9 = lVar9 + -0x28;
      if (lVar9 == 0) goto LAB_00169337;
      pvVar10 = pvVar7 + 1;
      iVar5 = strcmp(pvVar7[1].name_.ptr_,(pvVar7->name_).ptr_);
      pvVar7 = pvVar10;
    } while (-1 < iVar5);
  }
  if (pvVar10 == pvVar1) {
LAB_00169337:
    d = find<2ul>(this,(char (*) [2])0x177472);
    d_00 = find<3ul>(this,(char (*) [3])0x1775b8);
    if (d_00.pos_ != pvVar1 && d.pos_ != pvVar1) {
      local_38.ptr_ = this;
      pstore::gsl::not_null<const_pstore::romfs::directory_*>::ensure_invariant(&local_38);
      bVar3 = anon_unknown.dwarf_2386c6::is_expected_dir(d.pos_,local_38);
      if ((bVar3) &&
         (bVar3 = anon_unknown.dwarf_2386c6::is_expected_dir
                            (d_00.pos_,(not_null<const_directory_*>)parent.ptr_), bVar3)) {
        __name = (this->members_).ptr_;
        lVar9 = this->size_ * 0x28;
        bVar3 = true;
        local_68 = visited;
        do {
          if (lVar9 == 0) {
            return true;
          }
          if ((__name->stat_).mode == directory) {
            dirent::opendir((dirent *)&local_50,(char *)__name);
            if (local_50.has_error_ == false) {
              pnVar6 = error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>::
                       value_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>const&,pstore::gsl::not_null<pstore::romfs::directory_const*>const>
                                 (&local_50);
              local_60.d.ptr_ = pnVar6->ptr_;
              local_60.prev = local_68;
              pnVar6 = error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>::
                       value_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>const&,pstore::gsl::not_null<pstore::romfs::directory_const*>const>
                                 (&local_50);
              this_00 = pnVar6->ptr_;
              local_70.ptr_ = this;
              pstore::gsl::not_null<const_pstore::romfs::directory_*>::ensure_invariant(&local_70);
              bVar4 = check(this_00,local_70,&local_60);
              bVar3 = (bool)(bVar3 & bVar4);
            }
            else {
              bVar4 = false;
              bVar3 = false;
            }
            error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_>::~error_or(&local_50)
            ;
            if (bVar4 == false) {
              return bVar3;
            }
          }
          __name = __name + 1;
          lVar9 = lVar9 + -0x28;
        } while( true );
      }
    }
  }
  return false;
}

Assistant:

bool directory::check (gsl::not_null<directory const *> const parent,
                               check_stack_entry const * const visited) const {
            auto const end = this->end ();

            // This stops us from looping forever if we follow a directory pointer to a directory
            // that we have already visited.
            for (auto const * v = visited; v != nullptr; v = v->prev) {
                if (v->d == parent) {
                    return true;
                }
            }

            // Check that the directory entries are sorted by name.
            if (!std::is_sorted (begin (), end, [] (dirent const & a, dirent const & b) {
                    return std::strcmp (a.name (), b.name ()) < 0;
                })) {
                return false;
            }

            // Look for the '.' and '..' entries and check that they point where we expect.
            iterator const dot = this->find (".");
            iterator const dot_dot = this->find ("..");
            if (dot == end || dot_dot == end) {
                return false;
            }
            if (!is_expected_dir (*dot, this) || !is_expected_dir (*dot_dot, parent)) {
                return false;
            }

            // Recursively check any directories contained by this one.
            for (dirent const & de : *this) {
                if (de.is_directory ()) {
                    if (auto const od = de.opendir ()) {
                        check_stack_entry const me{*od, visited};
                        if (!(*od)->check (this, &me)) {
                            // Error: recursive check failed.
                            return false;
                        }
                    } else {
                        // Error: this entry claimed to be a directory but opendir() failed.
                        return false;
                    }
                }
            }

            return true;
        }